

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServerTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSocketServerTests::socketServerFixtureblockHelper::socketServerFixtureblockHelper
          (socketServerFixtureblockHelper *this,TestDetails *details)

{
  TestDetails *details_local;
  socketServerFixtureblockHelper *this_local;
  
  socketServerFixture::socketServerFixture(&this->super_socketServerFixture);
  (this->super_socketServerFixture).super_Strategy._vptr_Strategy =
       (_func_int **)&PTR__socketServerFixtureblockHelper_00465a10;
  this->m_details = details;
  return;
}

Assistant:

TEST_FIXTURE(socketServerFixture, block)
{
  SocketServer object( 0 );
  object.add( TestSettings::port, true, true );
  socket_handle clientS = createSocket( TestSettings::port, "127.0.0.1" );
  CHECK( clientS >= 0 );

  object.block( *this );
  CHECK_EQUAL( 1, connect );
  CHECK( connectSocket > 0 );

  send( clientS, "1", 1, 0 );
  object.block( *this );
  object.block( *this );
  CHECK_EQUAL( 1, data );
  CHECK_EQUAL( 1U, bufLen );
  CHECK_EQUAL( '1', *buf );
  CHECK( dataSocket > 0 );

  destroySocket( clientS );
  object.block( *this );
  CHECK_EQUAL( 1, disconnect );
  CHECK( disconnectSocket > 0 );
}